

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

Emb_Obj_t * Emb_ManFindDistances(Emb_Man_t *p,Vec_Int_t *vStart,Emb_Dat_t *pDist)

{
  int iVar1;
  uint hHandle;
  Vec_Int_t *p_00;
  Vec_Int_t *vNext_00;
  Emb_Obj_t *pEVar2;
  bool bVar3;
  int local_44;
  int i;
  Emb_Obj_t *pResult;
  Emb_Obj_t *pThis;
  Vec_Int_t *vNext;
  Vec_Int_t *vThis;
  Emb_Dat_t *pDist_local;
  Vec_Int_t *vStart_local;
  Emb_Man_t *p_local;
  
  p->nDistMax = 0;
  p->nReached = 0;
  p_00 = Vec_IntAlloc(1000);
  vNext_00 = Vec_IntAlloc(1000);
  Emb_ManIncrementTravId(p);
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vStart);
    bVar3 = false;
    if (local_44 < iVar1) {
      hHandle = Vec_IntEntry(vStart,local_44);
      pResult = Emb_ManObj(p,hHandle);
      bVar3 = pResult != (Emb_Obj_t *)0x0;
    }
    if (!bVar3) break;
    Emb_ObjSetTravIdCurrent(p,pResult);
    Vec_IntPush(p_00,pResult->hHandle);
    local_44 = local_44 + 1;
  }
  pEVar2 = Emb_ManPerformBfs(p,p_00,vNext_00,pDist);
  Vec_IntFree(p_00);
  Vec_IntFree(vNext_00);
  return pEVar2;
}

Assistant:

Emb_Obj_t * Emb_ManFindDistances( Emb_Man_t * p, Vec_Int_t * vStart, Emb_Dat_t * pDist )
{
    Vec_Int_t * vThis, * vNext;
    Emb_Obj_t * pThis, * pResult;
    int i;
    p->nReached = p->nDistMax = 0;
    vThis = Vec_IntAlloc( 1000 );
    vNext = Vec_IntAlloc( 1000 );
    Emb_ManIncrementTravId( p );
    Emb_ManForEachObjVec( vStart, p, pThis, i )
    {
        Emb_ObjSetTravIdCurrent( p, pThis );
        Vec_IntPush( vThis, pThis->hHandle );
    }
    pResult = Emb_ManPerformBfs( p, vThis, vNext, pDist );
    Vec_IntFree( vThis );
    Vec_IntFree( vNext );
    return pResult;
}